

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Export.cpp
# Opt level: O0

Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
exportC_abi_cxx11_(Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *__return_storage_ptr__,Resources *res,ExportSettings *settings,Pipeline *p,
                  IAutomation *automation)

{
  PixelType PVar1;
  uint uVar2;
  Flag FVar3;
  ulong uVar4;
  Framebuffer *pFVar5;
  Texture *pTVar6;
  bool bVar7;
  FILE *pFVar8;
  UniformsMap *pUVar9;
  size_type sVar10;
  undefined8 uVar11;
  ExportResult *pEVar12;
  reference str;
  element_type *peVar13;
  Source *pSVar14;
  pointer main;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  char *pcVar16;
  size_type sVar17;
  Texture *pTVar18;
  Framebuffer *pFVar19;
  const_reference pvVar20;
  const_reference pvVar21;
  undefined8 uVar22;
  reference pCVar23;
  BindFramebuffer *pBVar24;
  const_reference pvVar25;
  const_reference pvVar26;
  char *local_4e0;
  char *mode;
  Clear *cmdc;
  int slot;
  BindTexture *cmdtex;
  int pi;
  UseProgram *cmdp;
  Framebuffer *fb_1;
  BindFramebuffer *cmdfb;
  Command *cmd;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  vector<renderdesc::Command,_std::allocator<renderdesc::Command>_> *__range1_3;
  char *pcStack_478;
  int first_texture_slot;
  char *pingpong [3];
  string local_440;
  ulong local_420;
  size_t i_2;
  const_reference pvStack_410;
  int ti;
  Framebuffer *fb;
  size_t i_1;
  char *type;
  char *comp;
  Texture *t;
  size_t i;
  Section *it;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<Section,_std::allocator<Section>_> *__range1_2;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a0;
  undefined1 local_380 [8];
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result_1;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_338;
  undefined1 local_318 [8];
  Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  shader_source;
  shared_ptr<PolledShaderSource> shader_1;
  string vname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  ExportResult automation_result;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  basic_string_view<char,_std::char_traits<char>_> local_210;
  undefined1 local_200 [8];
  Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  automation_export;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  undefined1 local_168 [8];
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  undefined1 local_100 [8];
  shared_ptr<PolledShaderSource> shader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  UniformsMap global_uniforms;
  string local_90;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  _func_int__IO_FILE_ptr *local_50;
  undefined1 local_48 [8];
  unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> f;
  char *filename;
  IAutomation *automation_local;
  Pipeline *p_local;
  ExportSettings *settings_local;
  Resources *res_local;
  
  f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl = (_IO_FILE *)std::__cxx11::string::c_str();
  aAppDebugPrintf("Exporting rendering pipeline to \'%s\'",
                  f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                  super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                  super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
  pFVar8 = fopen((char *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                         super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                         super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,"w");
  local_50 = fclose;
  std::unique_ptr<_IO_FILE,int(*)(_IO_FILE*)>::unique_ptr<int(*)(_IO_FILE*),void>
            ((unique_ptr<_IO_FILE,int(*)(_IO_FILE*)> *)local_48,(pointer)pFVar8,&local_50);
  bVar7 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_48);
  if (bVar7) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>_>
           *)&__range1);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&p->shader_filenames);
    s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&p->shader_filenames);
    while (bVar7 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&s), bVar7) {
      shader.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
      Resources::getShaderSource((Resources *)local_100,(string *)res);
      bVar7 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_100);
      if (bVar7) {
        uVar11 = std::__cxx11::string::c_str();
        peVar13 = std::
                  __shared_ptr_access<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_100);
        pSVar14 = PolledShaderSource::flatSource(peVar13);
        pUVar9 = ::shader::Source::uniforms_abi_cxx11_(pSVar14);
        sVar10 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>_>
                 ::size(pUVar9);
        aAppDebugPrintf("%s: uniforms: %d",uVar11,sVar10 & 0xffffffff);
        peVar13 = std::
                  __shared_ptr_access<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_100);
        pSVar14 = PolledShaderSource::flatSource(peVar13);
        pUVar9 = ::shader::Source::uniforms_abi_cxx11_(pSVar14);
        ::shader::appendUniforms
                  ((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_168,(UniformsMap *)&__range1,pUVar9);
        bVar7 = Expected::operator_cast_to_bool((Expected *)local_168);
        if (!bVar7) {
          pbVar15 = Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::error((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_168);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &automation_export.has_value_,"Error merging uniforms from vertex: ",
                         pbVar15);
          Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Unexpected(&local_188,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &automation_export.has_value_);
          Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Expected(__return_storage_ptr__,&local_188);
          Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Unexpected(&local_188);
          std::__cxx11::string::~string((string *)&automation_export.has_value_);
        }
        global_uniforms._M_t._M_impl.super__Rb_tree_header._M_node_count._1_3_ = 0;
        global_uniforms._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = !bVar7;
        Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Expected((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_168);
      }
      else {
        uVar11 = std::__cxx11::string::c_str();
        format_abi_cxx11_((string *)&result.has_value_,"Cannot open shader \'%s\'",uVar11);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Unexpected(&local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &result.has_value_);
        Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,&local_120);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Unexpected(&local_120);
        std::__cxx11::string::~string((string *)&result.has_value_);
        global_uniforms._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
      }
      std::shared_ptr<PolledShaderSource>::~shared_ptr((shared_ptr<PolledShaderSource> *)local_100);
      if ((uint)global_uniforms._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
      goto LAB_0011c529;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_210,"C");
    (*(automation->super_IScope)._vptr_IScope[6])
              (local_200,automation,local_210._M_len,local_210._M_str,&__range1);
    bVar7 = Expected::operator_cast_to_bool((Expected *)local_200);
    if (bVar7) {
      pEVar12 = Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::value((Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_200);
      IAutomation::ExportResult::ExportResult((ExportResult *)&__range1_1,pEVar12);
      __end1_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&p->shader_filenames);
      s_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&p->shader_filenames);
      while (bVar7 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&s_1), bVar7) {
        str = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end1_1);
        validateName((string *)
                     &shader_1.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,str);
        Resources::getShaderSource((Resources *)&shader_source.has_value_,(string *)res);
        peVar13 = std::
                  __shared_ptr_access<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&shader_source.has_value_);
        pSVar14 = PolledShaderSource::flatSource(peVar13);
        shaderPreprocessor_abi_cxx11_
                  ((Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_318,pSVar14,(ExportResult *)&__range1_1);
        bVar7 = Expected::operator_cast_to_bool((Expected *)local_318);
        if (bVar7) {
          main = std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                           ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
          pbVar15 = Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::value((Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_318);
          writeShaderSource((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_380,main,str,
                            (string *)
                            &shader_1.
                             super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,pbVar15,settings);
          bVar7 = Expected::operator_cast_to_bool((Expected *)local_380);
          if (!bVar7) {
            uVar11 = std::__cxx11::string::c_str();
            Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::error((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_380);
            uVar22 = std::__cxx11::string::c_str();
            format_abi_cxx11_((string *)&__range1_2,"Cannot write shader \'%s\': %s",uVar11,uVar22);
            Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Unexpected(&local_3a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__range1_2);
            Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Expected(__return_storage_ptr__,&local_3a0);
            Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Unexpected(&local_3a0);
            std::__cxx11::string::~string((string *)&__range1_2);
          }
          global_uniforms._M_t._M_impl.super__Rb_tree_header._M_node_count._1_3_ = 0;
          global_uniforms._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = !bVar7;
          Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Expected((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_380);
          if ((uint)global_uniforms._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
            global_uniforms._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
          }
        }
        else {
          uVar11 = std::__cxx11::string::c_str();
          Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::error((Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_318);
          uVar22 = std::__cxx11::string::c_str();
          format_abi_cxx11_((string *)&result_1.has_value_,"Cannot preporcess shader \'%s\': %s",
                            uVar11,uVar22);
          Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Unexpected(&local_338,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &result_1.has_value_);
          Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Expected(__return_storage_ptr__,&local_338);
          Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Unexpected(&local_338);
          std::__cxx11::string::~string((string *)&result_1.has_value_);
          global_uniforms._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
        }
        Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Expected((Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_318);
        std::shared_ptr<PolledShaderSource>::~shared_ptr
                  ((shared_ptr<PolledShaderSource> *)&shader_source.has_value_);
        std::__cxx11::string::~string
                  ((string *)
                   &shader_1.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if ((uint)global_uniforms._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
        goto LAB_0011c4f1;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1_1);
      }
      __end1_2 = std::vector<Section,_std::allocator<Section>_>::begin
                           ((vector<Section,_std::allocator<Section>_> *)&__range1_1);
      it = (Section *)
           std::vector<Section,_std::allocator<Section>_>::end
                     ((vector<Section,_std::allocator<Section>_> *)&__range1_1);
      while (bVar7 = __gnu_cxx::operator!=
                               (&__end1_2,
                                (__normal_iterator<const_Section_*,_std::vector<Section,_std::allocator<Section>_>_>
                                 *)&it), bVar7) {
        i = (size_t)__gnu_cxx::
                    __normal_iterator<const_Section_*,_std::vector<Section,_std::allocator<Section>_>_>
                    ::operator*(&__end1_2);
        if (((reference)i)->type == Data) {
          pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                     ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
          uVar11 = std::__cxx11::string::c_str();
          fprintf(pFVar8,"#pragma data_seg(\".%s\")\n",uVar11);
          pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                     ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
          sVar17 = std::vector<char,_std::allocator<char>_>::size
                             ((vector<char,_std::allocator<char>_> *)(i + 0x48));
          pcVar16 = std::vector<char,_std::allocator<char>_>::data
                              ((vector<char,_std::allocator<char>_> *)(i + 0x48));
          fprintf(pFVar8,"%.*s\n",sVar17 & 0xffffffff,pcVar16);
        }
        __gnu_cxx::
        __normal_iterator<const_Section_*,_std::vector<Section,_std::allocator<Section>_>_>::
        operator++(&__end1_2);
      }
      bVar7 = std::vector<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>::empty
                        (&p->textures);
      if (!bVar7) {
        pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                   ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
        sVar17 = std::vector<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>::size
                           (&p->textures);
        fprintf(pFVar8,"static GLuint textures[%d];\n",sVar17 & 0xffffffff);
      }
      bVar7 = std::vector<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>::empty
                        (&p->framebuffers);
      if (!bVar7) {
        pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                   ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
        sVar17 = std::vector<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>::size
                           (&p->textures);
        fprintf(pFVar8,"static GLuint framebuffers[%d];\n",sVar17 & 0xffffffff);
      }
      pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                 ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
      sVar17 = std::vector<renderdesc::Program,_std::allocator<renderdesc::Program>_>::size
                         (&p->programs);
      fprintf(pFVar8,"static GLuint programs[%d];\n",sVar17 & 0xffffffff);
      pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                 ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
      fprintf(pFVar8,"\nstatic void videoInit() {\n");
      bVar7 = std::vector<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>::empty
                        (&p->textures);
      if (!bVar7) {
        pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                   ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
        sVar17 = std::vector<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>::size
                           (&p->textures);
        fprintf(pFVar8,"\tglGenTextures(%d, textures);\n",sVar17 & 0xffffffff);
      }
      bVar7 = std::vector<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>::empty
                        (&p->framebuffers);
      if (!bVar7) {
        pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                   ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
        sVar17 = std::vector<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>::
                 size(&p->framebuffers);
        fprintf(pFVar8,"\tglGenFramebuffers(%d, framebuffers);\n",sVar17 & 0xffffffff);
      }
      bVar7 = std::vector<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>::empty
                        (&p->textures);
      if (!bVar7) {
        for (t = (Texture *)0x0; pTVar6 = t,
            pTVar18 = (Texture *)
                      std::vector<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>::size
                                (&p->textures), pTVar6 < pTVar18; t = (Texture *)((long)&t->w + 1))
        {
          comp = (char *)std::vector<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>::
                         operator[](&p->textures,(size_type)t);
          type = "";
          i_1 = (long)
                "All those beautiful files will be deleted.\nThis operation cannot be undone!\n\n" +
                0x4d;
          PVar1 = ((const_reference)comp)->pixel_type;
          if (PVar1 == RGBA8) {
            type = "GL_RGBA";
            i_1 = (size_t)anon_var_dwarf_1c666;
          }
          else if (PVar1 == RGBA16F) {
            type = "GL_RGBA16F";
            i_1 = (size_t)anon_var_dwarf_1c686;
          }
          else if (PVar1 == RGBA32F) {
            type = "GL_RGBA32F";
            i_1 = (size_t)anon_var_dwarf_1c686;
          }
          pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                     ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
          fprintf(pFVar8,"\ttextureInit(textures[%d], %d, %d, %s, %s);\n",(ulong)t & 0xffffffff,
                  (ulong)*(uint *)comp,(ulong)*(uint *)(comp + 4),type,i_1);
        }
        pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                   ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
        fprintf(pFVar8,"\n");
      }
      bVar7 = std::vector<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>::empty
                        (&p->framebuffers);
      if (!bVar7) {
        for (fb = (Framebuffer *)0x0; pFVar5 = fb,
            pFVar19 = (Framebuffer *)
                      std::vector<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                      ::size(&p->framebuffers), pFVar5 < pFVar19;
            fb = (Framebuffer *)((long)&fb->textures_count + 1)) {
          pvStack_410 = std::
                        vector<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>::
                        operator[](&p->framebuffers,(size_type)fb);
          pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                     ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
          fprintf(pFVar8,"\tglBindFramebuffer(GL_FRAMEBUFFER, framebuffers[%d]);\n",
                  (ulong)fb & 0xffffffff);
          for (i_2._4_4_ = 0; (int)i_2._4_4_ < pvStack_410->textures_count;
              i_2._4_4_ = i_2._4_4_ + 1) {
            pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                       ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
            fprintf(pFVar8,
                    "\tglFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + %d, GL_TEXTURE_2D, textures[%d], 0);\n"
                    ,(ulong)i_2._4_4_,(ulong)(uint)pvStack_410->textures[(int)i_2._4_4_]);
          }
        }
        pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                   ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
        fprintf(pFVar8,"\n");
      }
      for (local_420 = 0; uVar4 = local_420,
          sVar17 = std::vector<renderdesc::Program,_std::allocator<renderdesc::Program>_>::size
                             (&p->programs), uVar4 < sVar17; local_420 = local_420 + 1) {
        pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                   ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
        uVar4 = local_420;
        pvVar20 = std::vector<renderdesc::Program,_std::allocator<renderdesc::Program>_>::operator[]
                            (&p->programs,local_420);
        pvVar21 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&p->shader_filenames,(long)pvVar20->vertex);
        validateName(&local_440,pvVar21);
        uVar11 = std::__cxx11::string::c_str();
        pvVar20 = std::vector<renderdesc::Program,_std::allocator<renderdesc::Program>_>::operator[]
                            (&p->programs,local_420);
        pvVar21 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&p->shader_filenames,(long)pvVar20->fragment);
        validateName((string *)(pingpong + 2),pvVar21);
        uVar22 = std::__cxx11::string::c_str();
        fprintf(pFVar8,"\tprograms[%d] = programInit(%s, %s);\n",uVar4 & 0xffffffff,uVar11,uVar22);
        std::__cxx11::string::~string((string *)(pingpong + 2));
        std::__cxx11::string::~string((string *)&local_440);
      }
      pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                 ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
      fprintf(pFVar8,"}\n\n");
      pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                 ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
      fprintf(pFVar8,
              "static const GLuint draw_buffers[] = {GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1, GL_COLOR_ATTACHMENT2, GL_COLOR_ATTACHMENT3};\n\n"
             );
      pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                 ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
      fprintf(pFVar8,"static void videoPaint(float t) {\n");
      pcStack_478 = "";
      pingpong[0] = "+ping";
      pingpong[1] = "+pong";
      pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                 ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
      fprintf(pFVar8,
              "\tint current_program;\n\tstatic unsigned int frame_seq = 0;\n\t++frame_seq;\n\tconst int ping = (int)(frame_seq&1), pong = (int)((frame_seq+1)&1);\n"
             );
      __range1_3._4_4_ = 0;
      __end1_3 = std::vector<renderdesc::Command,_std::allocator<renderdesc::Command>_>::begin
                           (&p->commands);
      cmd = (Command *)
            std::vector<renderdesc::Command,_std::allocator<renderdesc::Command>_>::end
                      (&p->commands);
      while (bVar7 = __gnu_cxx::operator!=
                               (&__end1_3,
                                (__normal_iterator<const_renderdesc::Command_*,_std::vector<renderdesc::Command,_std::allocator<renderdesc::Command>_>_>
                                 *)&cmd), bVar7) {
        pCVar23 = __gnu_cxx::
                  __normal_iterator<const_renderdesc::Command_*,_std::vector<renderdesc::Command,_std::allocator<renderdesc::Command>_>_>
                  ::operator*(&__end1_3);
        switch(pCVar23->op) {
        case BindFramebuffer:
          pBVar24 = &pCVar23->bindFramebuffer;
          if ((pBVar24->framebuffer).index == -1) {
            pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                       ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
            fprintf(pFVar8,"\tglBindFramebuffer(GL_FRAMEBUFFER, 0);\n");
            pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                       ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
            fprintf(pFVar8,"\tglViewport(0, 0, %d, %d);\n",(ulong)(uint)settings->width,
                    (ulong)(uint)settings->height);
          }
          else {
            pvVar25 = std::vector<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                      ::operator[](&p->framebuffers,(long)(pBVar24->framebuffer).index);
            pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                       ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
            fprintf(pFVar8,"\tglBindFramebuffer(GL_FRAMEBUFFER, framebuffers[%d%s]);\n",
                    (ulong)(uint)(pBVar24->framebuffer).index,
                    *(undefined8 *)
                     ((long)&stack0xfffffffffffffb88 +
                     (ulong)(pCVar23->bindFramebuffer).framebuffer.pingpong * 8));
            pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                       ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
            fprintf(pFVar8,"\tglDrawBuffers(%d, draw_buffers);\n",
                    (ulong)(uint)pvVar25->textures_count);
            pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                       ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
            pvVar26 = std::vector<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>::
                      operator[](&p->textures,(long)pvVar25->textures[0]);
            uVar2 = pvVar26->w;
            pvVar26 = std::vector<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>::
                      operator[](&p->textures,(long)pvVar25->textures[0]);
            fprintf(pFVar8,"\tglViewport(0, 0, %d, %d);\n",(ulong)uVar2,(ulong)(uint)pvVar26->h);
          }
          break;
        case UseProgram:
          uVar2 = (pCVar23->useProgram).program.index;
          pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                     ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
          fprintf(pFVar8,"\tcurrent_program = programs[%d];\n",(ulong)uVar2);
          pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                     ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
          fprintf(pFVar8,"\tglUseProgram(current_program);\n");
          pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                     ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
          fprintf(pFVar8,
                  "\tglUniform1fv(glGetUniformLocation(current_program, \"u\"), AUTOMATION_SIZE, uniforms);\n"
                 );
          pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                     ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
          fprintf(pFVar8,"\tglUniform2f(glGetUniformLocation(current_program, \"R\"), %d, %d);\n",
                  (ulong)(uint)settings->width,(ulong)(uint)settings->height);
          pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                     ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
          fprintf(pFVar8,"\tglUniform1f(glGetUniformLocation(current_program, \"t\"), t);\n");
          __range1_3._4_4_ = 0;
          break;
        case BindTexture:
          pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                     ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
          fprintf(pFVar8,"\tglActiveTexture(GL_TEXTURE0 + %d);\n",(ulong)__range1_3._4_4_);
          pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                     ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
          fprintf(pFVar8,"\tglBindTexture(GL_TEXTURE_2D, textures[%d%s]);\n",
                  (ulong)(uint)(pCVar23->bindTexture).texture.index,
                  *(undefined8 *)
                   ((long)&stack0xfffffffffffffb88 +
                   (ulong)(pCVar23->bindTexture).texture.pingpong * 8));
          pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                     ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
          uVar11 = std::__cxx11::string::c_str();
          fprintf(pFVar8,"\tglUniform1i(glGetUniformLocation(current_program, \"%s\"), %d);\n",
                  uVar11,(ulong)__range1_3._4_4_);
          __range1_3._4_4_ = __range1_3._4_4_ + 1;
          break;
        case DrawFullscreen:
          pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                     ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
          fprintf(pFVar8,"\tglRects(-1,-1,1,1);\n");
          break;
        case Clear:
          pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                     ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
          fprintf(pFVar8,"\tglClearColor(%f, %f, %f, %f);\n",(double)(pCVar23->clear).r,
                  (double)(pCVar23->clear).g,(double)(pCVar23->clear).b,(double)(pCVar23->clear).a);
          pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                     ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
          pcVar16 = "";
          if (((pCVar23->clear).depth & 1U) != 0) {
            pcVar16 = " | GL_DEPTH_BUFFER_BIT";
          }
          fprintf(pFVar8,"\tglClear(GL_COLOR_BUFFER_BIT%s);\n",pcVar16);
          break;
        case Enable:
          FVar3 = (pCVar23->enable).flag;
          if (FVar3 == DepthTest) {
            pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                       ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
            fprintf(pFVar8,"\tglEnable(GL_DEPTH_TEST);\n");
          }
          else if (FVar3 == VertexProgramPointSize) {
            pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                       ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
            fprintf(pFVar8,"\tglEnable(GL_VERTEX_PROGRAM_POINT_SIZE);\n");
          }
          break;
        case Disable:
          FVar3 = (pCVar23->disable).flag;
          if (FVar3 == DepthTest) {
            pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                       ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
            fprintf(pFVar8,"\tglDisable(GL_DEPTH_TEST);\n");
          }
          else if (FVar3 == VertexProgramPointSize) {
            pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                       ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
            fprintf(pFVar8,"\tglDisable(GL_VERTEX_PROGRAM_POINT_SIZE);\n");
          }
          break;
        case DrawArrays:
          local_4e0 = (char *)0x0;
          switch((pCVar23->drawArrays).mode) {
          case Points:
            local_4e0 = "GL_POINTS";
            break;
          case Lines:
            local_4e0 = "GL_LINES";
            break;
          case LineLoop:
            local_4e0 = "GL_LINE_LOOP";
            break;
          case LineStrip:
            local_4e0 = "GL_LINE_STRIP";
            break;
          case Triangles:
            local_4e0 = "GL_TRIANGLES";
            break;
          case TriangleStrip:
            local_4e0 = "GL_TRIANGLE_STRIP";
            break;
          case TriangleFan:
            local_4e0 = "GL_TRIANGLE_FAN";
          }
          pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                     ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
          fprintf(pFVar8,"\tglDrawArrays(%s, %d, %d);\n",local_4e0,
                  (ulong)(uint)(pCVar23->drawArrays).start,(ulong)(uint)(pCVar23->drawArrays).count)
          ;
        }
        __gnu_cxx::
        __normal_iterator<const_renderdesc::Command_*,_std::vector<renderdesc::Command,_std::allocator<renderdesc::Command>_>_>
        ::operator++(&__end1_3);
      }
      pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                                 ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
      fprintf(pFVar8,"}\n");
      aAppDebugPrintf("Done exporting rendering pipeline to \'%s\'",
                      f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                      super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                      super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
      Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Expected(__return_storage_ptr__);
      global_uniforms._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
LAB_0011c4f1:
      IAutomation::ExportResult::~ExportResult((ExportResult *)&__range1_1);
    }
    else {
      Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::error((Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_200);
      uVar11 = std::__cxx11::string::c_str();
      format_abi_cxx11_((string *)&automation_result.buffer_size,
                        "Error exporting automation data: %s",uVar11);
      Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Unexpected(&local_230,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &automation_result.buffer_size);
      Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Expected(__return_storage_ptr__,&local_230);
      Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~Unexpected(&local_230);
      std::__cxx11::string::~string((string *)&automation_result.buffer_size);
      global_uniforms._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
    }
    Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_200);
LAB_0011c529:
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>_>
            *)&__range1);
  }
  else {
    format_abi_cxx11_(&local_90,"Cannot open file \'%s\' for writing",
                      f._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                      super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                      super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Unexpected(&local_70,&local_90);
    Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,&local_70);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Unexpected(&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    global_uniforms._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
  }
  std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::~unique_ptr
            ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Expected<void, std::string> exportC(Resources &res, const ExportSettings &settings, const renderdesc::Pipeline &p, const IAutomation &automation) {
	const char * const filename = settings.c_source.c_str();
	MSG("Exporting rendering pipeline to '%s'", filename);

	const auto f = std::unique_ptr<FILE, decltype(&fclose)>(fopen(filename, "w"), &fclose);
	if (!f)
		return Unexpected(format("Cannot open file '%s' for writing", filename));

	// Extract all uniforms from all shaders
	shader::UniformsMap global_uniforms;
	for (const auto &s: p.shader_filenames) {
		const auto shader = res.getShaderSource(s);
		if (!shader)
			return Unexpected(format("Cannot open shader '%s'", s.c_str()));

		// if (!shader->poll(1))
		// 	return Unexpected(format("Cannot read shader '%s'", s.c_str()));

		MSG("%s: uniforms: %d", s.c_str(), (int)shader->flatSource().uniforms().size());
		const auto result = shader::appendUniforms(global_uniforms, shader->flatSource().uniforms());
		if (!result)
			return Unexpected("Error merging uniforms from vertex: " + result.error());
	}

	// Export automation for all known uniforms
	auto automation_export = automation.writeExport("C", global_uniforms);
	if (!automation_export)
		return Unexpected(format("Error exporting automation data: %s", automation_export.error().c_str()));

	const IAutomation::ExportResult automation_result(std::move(automation_export.value()));

	// write shader sources given automation export
	for (const auto &s: p.shader_filenames) {
		const std::string vname = validateName(s);
		const auto shader = res.getShaderSource(s);

		auto shader_source = shaderPreprocessor(shader->flatSource(), automation_result);
		if (!shader_source)
			return Unexpected(format("Cannot preporcess shader '%s': %s", s.c_str(), shader_source.error().c_str()));

		if (auto result = writeShaderSource(f.get(), s, vname, shader_source.value(), settings)) {}
		else
			return Unexpected(format("Cannot write shader '%s': %s", vname.c_str(), result.error().c_str()));
	}

	// Write global data
	for (const auto &it: automation_result.sections) {
		if (it.type == Section::Type::Data) {
			fprintf(f.get(), "#pragma data_seg(\".%s\")\n", it.name.c_str());
			fprintf(f.get(), "%.*s\n", static_cast<int>(it.data.size()), it.data.data());
		}
	}

	if (!p.textures.empty())
		fprintf(f.get(), "static GLuint textures[%d];\n", (int)p.textures.size());

	if (!p.framebuffers.empty())
		fprintf(f.get(), "static GLuint framebuffers[%d];\n", (int)p.textures.size());

	fprintf(f.get(), "static GLuint programs[%d];\n", (int)p.programs.size());

	fprintf(f.get(), "\nstatic void videoInit() {\n");

	if (!p.textures.empty())
		fprintf(f.get(), "\tglGenTextures(%d, textures);\n", (int)p.textures.size());

	if (!p.framebuffers.empty())
		fprintf(f.get(), "\tglGenFramebuffers(%d, framebuffers);\n", (int)p.framebuffers.size());

	if (!p.textures.empty()) {
		for (size_t i = 0; i < p.textures.size(); ++i) {
			const renderdesc::Texture &t = p.textures[i];
			const char *comp = "", *type = "";

			switch (t.pixel_type) {
				case RGBA8:
					comp = "GL_RGBA";
					type = "GL_UNSIGNED_BYTE";
					break;
#ifndef ATTO_PLATFORM_RPI
				case RGBA16F:
					comp = "GL_RGBA16F";
					type = "GL_FLOAT";
					break;
				case RGBA32F:
					comp = "GL_RGBA32F";
					type = "GL_FLOAT";
					break;
#endif
			}

			fprintf(f.get(), "\ttextureInit(textures[%d], %d, %d, %s, %s);\n",
				(int)i, t.w, t.h, comp, type);
		}

		fprintf(f.get(), "\n");
	}

	if (!p.framebuffers.empty()) {
		for (size_t i = 0; i < p.framebuffers.size(); ++i) {
			const renderdesc::Framebuffer &fb = p.framebuffers[i];
			fprintf(f.get(), "\tglBindFramebuffer(GL_FRAMEBUFFER, framebuffers[%d]);\n", (int)i);
			for (int ti = 0; ti < fb.textures_count; ++ti) {
				fprintf(f.get(), "\tglFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + %d, "
					"GL_TEXTURE_2D, textures[%d], 0);\n", ti, fb.textures[ti]);
			}
		}

		fprintf(f.get(), "\n");
	}

	for (size_t i = 0; i < p.programs.size(); ++i) {
		fprintf(f.get(), "\tprograms[%d] = programInit(%s, %s);\n", (int)i,
			validateName(p.shader_filenames[p.programs[i].vertex]).c_str(),
			validateName(p.shader_filenames[p.programs[i].fragment]).c_str());
	}

	fprintf(f.get(), "}\n\n");

	// TODO actual count
	fprintf(f.get(), "static const GLuint draw_buffers[] = {GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1, GL_COLOR_ATTACHMENT2, GL_COLOR_ATTACHMENT3};\n\n");

	fprintf(f.get(), "static void videoPaint(float t) {\n");

	const char *pingpong[3] = {"", "+ping", "+pong"};
	fprintf(f.get(),
		"\tint current_program;\n"
		"\tstatic unsigned int frame_seq = 0;\n"
		"\t++frame_seq;\n"
		"\tconst int ping = (int)(frame_seq&1), pong = (int)((frame_seq+1)&1);\n");

	int first_texture_slot = 0;
	for (const auto &cmd: p.commands) {
		switch (cmd.op) {
			case renderdesc::Command::Op::BindFramebuffer:
				{
					const renderdesc::Command::BindFramebuffer &cmdfb = cmd.bindFramebuffer;
					if (cmdfb.framebuffer.index == -1) {
						fprintf(f.get(), "\tglBindFramebuffer(GL_FRAMEBUFFER, 0);\n");
						fprintf(f.get(), "\tglViewport(0, 0, %d, %d);\n", settings.width, settings.height);
					} else {
						const renderdesc::Framebuffer &fb = p.framebuffers[cmdfb.framebuffer.index];
						fprintf(f.get(), "\tglBindFramebuffer(GL_FRAMEBUFFER, framebuffers[%d%s]);\n",
							cmdfb.framebuffer.index, pingpong[cmdfb.framebuffer.pingpong]);
						fprintf(f.get(), "\tglDrawBuffers(%d, draw_buffers);\n", fb.textures_count);
						fprintf(f.get(), "\tglViewport(0, 0, %d, %d);\n",
							p.textures[fb.textures[0]].w,
							p.textures[fb.textures[0]].h);
					}
					break;
				}

			case renderdesc::Command::Op::UseProgram:
				{
					const renderdesc::Command::UseProgram &cmdp = cmd.useProgram;
					const int pi = cmdp.program.index;
					fprintf(f.get(), "\tcurrent_program = programs[%d];\n", pi);
					fprintf(f.get(), "\tglUseProgram(current_program);\n");
					fprintf(f.get(), "\tglUniform1fv(glGetUniformLocation(current_program, \"u\"), AUTOMATION_SIZE, uniforms);\n");
					fprintf(f.get(), "\tglUniform2f(glGetUniformLocation(current_program, \"R\"), %d, %d);\n", settings.width, settings.height);
					fprintf(f.get(), "\tglUniform1f(glGetUniformLocation(current_program, \"t\"), t);\n");

					// FIXME load automated uniforms

					first_texture_slot = 0;
					break;
				}

			case renderdesc::Command::Op::BindTexture:
				{
					const auto &cmdtex = cmd.bindTexture;
					const int slot = first_texture_slot++;
					fprintf(f.get(), "\tglActiveTexture(GL_TEXTURE0 + %d);\n", slot);
					fprintf(f.get(), "\tglBindTexture(GL_TEXTURE_2D, textures[%d%s]);\n", cmdtex.texture.index, pingpong[cmdtex.texture.pingpong]);
					fprintf(f.get(), "\tglUniform1i(glGetUniformLocation(current_program, \"%s\"), %d);\n", cmdtex.name.c_str(), slot);
					break;
				}

			case renderdesc::Command::Op::Clear:
				{
					const auto &cmdc = cmd.clear;
					fprintf(f.get(), "\tglClearColor(%f, %f, %f, %f);\n", cmdc.r, cmdc.g, cmdc.b, cmdc.a);
					fprintf(f.get(), "\tglClear(GL_COLOR_BUFFER_BIT%s);\n", cmdc.depth?" | GL_DEPTH_BUFFER_BIT":"");
					break;
				}

			case renderdesc::Command::Op::Enable:
				switch (cmd.enable.flag) {
					case renderdesc::Command::Flag::DepthTest:
						fprintf(f.get(), "\tglEnable(GL_DEPTH_TEST);\n");
						break;
#ifndef ATTO_PLATFORM_RPI
					case renderdesc::Command::Flag::VertexProgramPointSize:
						fprintf(f.get(), "\tglEnable(GL_VERTEX_PROGRAM_POINT_SIZE);\n");
						break;
#endif
				}
				break;
			case renderdesc::Command::Op::Disable:
				switch (cmd.disable.flag) {
					case renderdesc::Command::Flag::DepthTest:
						fprintf(f.get(), "\tglDisable(GL_DEPTH_TEST);\n");
						break;
#ifndef ATTO_PLATFORM_RPI
					case renderdesc::Command::Flag::VertexProgramPointSize:
						fprintf(f.get(), "\tglDisable(GL_VERTEX_PROGRAM_POINT_SIZE);\n");
						break;
#endif
				}
				break;
			case renderdesc::Command::Op::DrawArrays:
				{
					const char *mode = nullptr;
					switch (cmd.drawArrays.mode) {
						case renderdesc::Command::DrawArrays::Mode::Lines: mode = "GL_LINES"; break;
						case renderdesc::Command::DrawArrays::Mode::LineStrip: mode = "GL_LINE_STRIP"; break;
						case renderdesc::Command::DrawArrays::Mode::LineLoop: mode = "GL_LINE_LOOP"; break;
						case renderdesc::Command::DrawArrays::Mode::Points: mode = "GL_POINTS"; break;
						case renderdesc::Command::DrawArrays::Mode::Triangles: mode = "GL_TRIANGLES"; break;
						case renderdesc::Command::DrawArrays::Mode::TriangleStrip: mode = "GL_TRIANGLE_STRIP"; break;
						case renderdesc::Command::DrawArrays::Mode::TriangleFan: mode = "GL_TRIANGLE_FAN"; break;
					}
					fprintf(f.get(), "\tglDrawArrays(%s, %d, %d);\n", mode, cmd.drawArrays.start, cmd.drawArrays.count);
				}
				break;
			case renderdesc::Command::Op::DrawFullscreen:
				fprintf(f.get(), "\tglRects(-1,-1,1,1);\n");
				break;
		}
	}

	fprintf(f.get(), "}\n");
	MSG("Done exporting rendering pipeline to '%s'", filename);

	return Expected<void, std::string>();
}